

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.h
# Opt level: O1

void __thiscall
ze_lib::context_t::debug_trace_message(context_t *this,string *message,string *result)

{
  ostream *poVar1;
  string debugTracePrefix;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (this->debugTraceEnabled == true) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ZE_LOADER_DEBUG_TRACE:","")
    ;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_40,local_38);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(result->_M_dataplus)._M_p,result->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return;
}

Assistant:

__zedlllocal void debug_trace_message(std::string message, std::string result) {
        if (debugTraceEnabled){
            std::string debugTracePrefix = "ZE_LOADER_DEBUG_TRACE:";
            std::cerr << debugTracePrefix << message << result << std::endl;
        }
    }